

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UBool icu_63::ICU_Utility::parseChar(UnicodeString *id,int32_t *pos,UChar ch)

{
  short sVar1;
  UBool UVar2;
  char16_t cVar3;
  int iVar4;
  int32_t iVar5;
  
  iVar5 = *pos;
  skipWhitespace(id,pos,'\x01');
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (id->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (*pos != iVar4) {
    cVar3 = UnicodeString::doCharAt(id,*pos);
    if (cVar3 == ch) {
      iVar5 = *pos + 1;
      UVar2 = '\x01';
      goto LAB_002c10f4;
    }
  }
  UVar2 = '\0';
LAB_002c10f4:
  *pos = iVar5;
  return UVar2;
}

Assistant:

UBool ICU_Utility::parseChar(const UnicodeString& id, int32_t& pos, UChar ch) {
    int32_t start = pos;
    skipWhitespace(id, pos, TRUE);
    if (pos == id.length() ||
        id.charAt(pos) != ch) {
        pos = start;
        return FALSE;
    }
    ++pos;
    return TRUE;
}